

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O2

Action __thiscall
psy::C::TypeChecker::visitAssignmentExpression(TypeChecker *this,AssignmentExpressionSyntax *node)

{
  Action AVar1;
  bool bVar2;
  Action AVar3;
  Type *leftTy;
  Type *rightTy;
  ostream *poVar4;
  SyntaxToken local_68;
  
  AVar1 = visitExpression(this,&((node->super_MIXIN_LeftExpressionInfixOperatorRightExpression).
                                leftExpr_)->super_SyntaxNode);
  AVar3 = Quit;
  if ((AVar1 != Quit) &&
     (bVar2 = isAssignable(this,&((node->super_MIXIN_LeftExpressionInfixOperatorRightExpression).
                                 leftExpr_)->super_SyntaxNode,this->ty_), bVar2)) {
    leftTy = unqualifiedAndResolved(this->ty_);
    AVar1 = visitExpression(this,&((node->super_MIXIN_LeftExpressionInfixOperatorRightExpression).
                                  rightExpr_)->super_SyntaxNode);
    if (AVar1 != Quit) {
      rightTy = unqualifiedAndResolved(this->ty_);
      AssignmentExpressionSyntax::operatorToken(&local_68,node);
      SyntaxToken::~SyntaxToken(&local_68);
      switch(local_68.syntaxK_) {
      case LessThanEqualsToken:
      case GreaterThanEqualsToken:
        AVar3 = visitBinaryExpression_BitwiseShift<psy::C::AssignmentExpressionSyntax>
                          (this,node,leftTy,rightTy);
        break;
      default:
        poVar4 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeChecker.cpp"
                                );
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x56c);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = std::operator<<(poVar4,"<empty message>");
        std::endl<char,std::char_traits<char>>(poVar4);
        break;
      case ExclamationEqualsToken:
      case AmpersandEqualsToken:
      case CaretEqualsToken:
        AVar3 = Skip;
        break;
      case EqualsToken:
        AVar3 = visitAssignmentExpression_Simple(this,node,leftTy,rightTy);
        break;
      case AsteriskEqualsToken:
      case SlashEqualsToken:
        AVar3 = visitBinaryExpression_MultiplicationOrDivision<psy::C::AssignmentExpressionSyntax>
                          (this,node,leftTy,rightTy);
        break;
      case PercentEqualsToken:
        AVar3 = visitBinaryExpression_Remainder<psy::C::AssignmentExpressionSyntax>
                          (this,node,leftTy,rightTy);
        break;
      case PlusEqualsToken:
        AVar3 = visitBinaryExpression_Addition<psy::C::AssignmentExpressionSyntax>
                          (this,node,leftTy,rightTy);
        break;
      case MinusEqualsToken:
        AVar3 = visitBinaryExpression_Subtraction<psy::C::AssignmentExpressionSyntax>
                          (this,node,leftTy,rightTy);
      }
    }
  }
  return AVar3;
}

Assistant:

SyntaxVisitor::Action TypeChecker::visitAssignmentExpression(
        const AssignmentExpressionSyntax* node)
{
    VISIT_EXPR(node->left());
    if (!isAssignable(node->left(), ty_))
        return Action::Quit;
    auto leftTy = unqualifiedAndResolved(ty_);
    VISIT_EXPR(node->right());
    auto rightTy = unqualifiedAndResolved(ty_);

    switch (node->operatorToken().kind()) {
        case SyntaxKind::EqualsToken:
            return visitAssignmentExpression_Simple(node, leftTy, rightTy);
        case SyntaxKind::AsteriskEqualsToken:
        case SyntaxKind::SlashEqualsToken:
            return visitBinaryExpression_MultiplicationOrDivision(node, leftTy, rightTy);
        case SyntaxKind::PercentEqualsToken:
            return visitBinaryExpression_Remainder(node, leftTy, rightTy);
        case SyntaxKind::PlusEqualsToken:
            return visitBinaryExpression_Addition(node, leftTy, rightTy);
        case SyntaxKind::MinusEqualsToken:
            return visitBinaryExpression_Subtraction(node, leftTy, rightTy);
        case SyntaxKind::LessThanEqualsToken:
        case SyntaxKind::GreaterThanEqualsToken:
            return visitBinaryExpression_BitwiseShift(node, leftTy, rightTy);
        case SyntaxKind::AmpersandEqualsToken:
        case SyntaxKind::ExclamationEqualsToken:
        case SyntaxKind::CaretEqualsToken:
            return visitBinaryExpression_Bitwise(node, leftTy, rightTy);
        default:
            PSY_ASSERT_1(false);
            return Action::Quit;
    }

    return Action::Skip;
}